

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  byte bVar1;
  long lVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *in_RCX;
  long *plVar6;
  long lVar7;
  long *plVar8;
  undefined4 in_register_00000034;
  VariableIndex VVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  Expression EVar14;
  Expression i_aot;
  Expression i_ot;
  Expression i_awt;
  Expression ph_t;
  Expression i_it;
  Expression i_wt;
  Expression i_ft;
  ComputationGraph *local_1b8;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  long local_198;
  undefined1 local_190 [16];
  pointer local_180;
  undefined4 local_178;
  ComputationGraph *local_170;
  uint local_168;
  ExecutionEngine *local_160;
  undefined4 local_158;
  pointer local_150;
  undefined4 local_148;
  uint local_13c;
  undefined1 local_138 [8];
  ulong local_130;
  ulong local_128;
  pointer local_120;
  long local_118;
  Expression local_110;
  Expression local_100;
  Expression local_f0;
  Expression local_e0;
  long local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  undefined1 local_b0 [8];
  size_type local_a8;
  Expression local_a0;
  FastLSTMBuilder *local_90;
  long *local_88;
  long *local_80;
  long local_78;
  vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
  *local_70;
  vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
  *local_68;
  initializer_list<dynet::expr::Expression> local_60;
  initializer_list<dynet::expr::Expression> local_50;
  Expression local_40;
  
  lVar7 = CONCAT44(in_register_00000034,prev);
  local_13c = (uint)x;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_190,
             (ulong)*(uint *)(lVar7 + 200),(allocator_type *)&local_f0);
  local_68 = (vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
              *)(lVar7 + 0x60);
  std::
  vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
  ::emplace_back<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            (local_68,(vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                      local_190);
  if ((ComputationGraph *)local_190._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_190._0_8_);
  }
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_190,
             (ulong)*(uint *)(lVar7 + 200),(allocator_type *)&local_f0);
  local_70 = (vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
              *)(lVar7 + 0x78);
  local_90 = this;
  std::
  vector<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>,std::allocator<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>>
  ::emplace_back<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            (local_70,(vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                      local_190);
  if ((ComputationGraph *)local_190._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_190._0_8_);
  }
  local_c8 = *(long *)(lVar7 + 0x68);
  if (*(int *)(lVar7 + 200) != 0) {
    local_118 = *(long *)(lVar7 + 0x80);
    local_1b8 = (ComputationGraph *)*in_RCX;
    lVar11 = 0;
    local_c0 = 0;
    local_80 = (long *)(lVar7 + 0x98);
    local_88 = (long *)(lVar7 + 0xb0);
    lVar10 = 0;
    local_78 = (ulong)local_13c << 3;
    VVar9.t = *(uint *)(in_RCX + 1);
    local_d0 = lVar7;
    do {
      lVar2 = *(long *)(lVar7 + 0x48);
      local_f0.pg = (ComputationGraph *)0x0;
      local_f0.i.t = 0;
      bVar12 = (int)local_13c < 0;
      bVar1 = *(byte *)(lVar7 + 0x90);
      if (bVar12) {
        plVar6 = local_88;
        plVar8 = local_80;
        if ((bVar1 & 1) != 0) goto LAB_0031a380;
        local_128 = 0;
        local_120 = (pointer)0x0;
      }
      else {
        plVar6 = (long *)(local_78 * 3 + *(long *)local_70);
        plVar8 = (long *)(*(long *)local_68 + local_78 * 3);
LAB_0031a380:
        local_120 = *(pointer *)(*plVar8 + lVar10);
        local_128 = (ulong)*(uint *)(*plVar8 + 8 + lVar10);
        local_f0.pg = *(ComputationGraph **)(*plVar6 + lVar10);
        local_f0.i.t = *(uint *)(*plVar6 + 8 + lVar10);
      }
      local_a0.pg = (ComputationGraph *)0x0;
      local_a0.i.t = 0;
      local_198 = lVar2;
      local_168 = VVar9.t;
      if (bVar12 && (bVar1 & 1) == 0) {
        puVar3 = *(undefined8 **)(lVar2 + lVar11);
        local_190._0_8_ = puVar3[6];
        local_190._8_4_ = *(undefined4 *)(puVar3 + 7);
        local_180 = (pointer)*puVar3;
        local_60._M_array = (iterator)local_190;
        local_178 = *(undefined4 *)(puVar3 + 1);
        local_60._M_len = 3;
        local_170 = local_1b8;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)&local_100,&local_60);
      }
      else {
        puVar3 = *(undefined8 **)(lVar2 + lVar11);
        local_190._0_8_ = puVar3[6];
        local_190._8_4_ = *(undefined4 *)(puVar3 + 7);
        local_180 = (pointer)*puVar3;
        local_178 = *(undefined4 *)(puVar3 + 1);
        local_170 = local_1b8;
        local_160 = (ExecutionEngine *)puVar3[2];
        local_138 = (undefined1  [8])local_190;
        local_158 = *(undefined4 *)(puVar3 + 3);
        local_130 = 5;
        local_150 = local_120;
        local_148 = (undefined4)local_128;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)&local_60,(initializer_list<dynet::expr::Expression> *)local_138);
        dynet::expr::cmult((expr *)&local_e0,(Expression *)(*(long *)(lVar2 + lVar11) + 0x20),
                           &local_f0);
        dynet::expr::operator+((expr *)&local_100,(Expression *)&local_60,&local_e0);
      }
      local_a0.pg = local_100.pg;
      local_a0.i.t = local_100.i.t;
      dynet::expr::logistic((expr *)&local_100,&local_a0);
      dVar13 = SUB648(ZEXT464(0x3f800000),0);
      dynet::expr::operator-((expr *)&local_60,1.0,&local_100);
      local_138 = (undefined1  [8])0x0;
      local_130 = local_130 & 0xffffffff00000000;
      local_b8 = lVar11;
      if (bVar12 && (bVar1 & 1) == 0) {
        local_1a8 = (undefined1  [8])local_190;
        lVar7 = *(long *)(local_198 + lVar11);
        local_190._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
        local_190._8_4_ = *(uint *)(lVar7 + 0xa8);
        local_180 = *(pointer *)(lVar7 + 0x80);
        local_178 = *(undefined4 *)(lVar7 + 0x88);
        local_170 = local_1b8;
        local_1a0 = 3;
        local_168 = VVar9.t;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)&local_e0,(initializer_list<dynet::expr::Expression> *)local_1a8);
        local_138 = (undefined1  [8])local_e0.pg;
        local_130 = CONCAT44(local_130._4_4_,local_e0.i.t);
        dVar13 = dynet::expr::tanh((expr *)&local_e0,dVar13);
        dynet::expr::cmult((expr *)local_190,&local_100,&local_e0);
        lVar7 = *(long *)(local_118 + -0x18);
        *(undefined8 *)(lVar7 + lVar10) = local_190._0_8_;
        *(undefined4 *)(lVar7 + 8 + lVar10) = local_190._8_4_;
        local_1a8 = (undefined1  [8])0x0;
        local_1a0 = local_1a0 & 0xffffffff00000000;
        lVar7 = *(long *)(local_198 + lVar11);
        local_190._0_8_ = *(undefined8 *)(lVar7 + 0x70);
        local_190._8_4_ = *(uint *)(lVar7 + 0x78);
        local_180 = *(pointer *)(lVar7 + 0x40);
        local_178 = *(undefined4 *)(lVar7 + 0x48);
        local_170 = local_1b8;
        local_a8 = 3;
        local_168 = VVar9.t;
        local_b0 = (undefined1  [8])local_190;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)&local_110,(initializer_list<dynet::expr::Expression> *)local_b0);
      }
      else {
        local_1a8 = (undefined1  [8])local_190;
        lVar7 = *(long *)(local_198 + lVar11);
        local_190._0_8_ = *(undefined8 *)(lVar7 + 0xa0);
        local_190._8_4_ = *(uint *)(lVar7 + 0xa8);
        local_180 = *(pointer *)(lVar7 + 0x80);
        local_178 = *(undefined4 *)(lVar7 + 0x88);
        local_170 = local_1b8;
        local_160 = *(ExecutionEngine **)(lVar7 + 0x90);
        local_158 = *(undefined4 *)(lVar7 + 0x98);
        local_150 = local_120;
        local_148 = (undefined4)local_128;
        local_1a0 = 5;
        local_168 = VVar9.t;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)&local_e0,(initializer_list<dynet::expr::Expression> *)local_1a8);
        local_138 = (undefined1  [8])local_e0.pg;
        local_130 = CONCAT44(local_130._4_4_,local_e0.i.t);
        dVar13 = dynet::expr::tanh((expr *)&local_e0,dVar13);
        dynet::expr::cmult((expr *)local_190,&local_100,&local_e0);
        dynet::expr::cmult((expr *)local_1a8,(Expression *)&local_60,&local_f0);
        dynet::expr::operator+((expr *)&local_110,(Expression *)local_1a8,(Expression *)local_190);
        lVar5 = local_b8;
        lVar2 = local_118;
        lVar11 = local_198;
        lVar7 = *(long *)(local_118 + -0x18);
        *(ComputationGraph **)(lVar7 + lVar10) = local_110.pg;
        *(uint *)(lVar7 + 8 + lVar10) = local_110.i.t;
        local_1a8 = (undefined1  [8])0x0;
        local_1a0 = local_1a0 & 0xffffffff00000000;
        lVar7 = *(long *)(local_198 + local_b8);
        local_190._0_8_ = *(undefined8 *)(lVar7 + 0x70);
        local_190._8_4_ = *(uint *)(lVar7 + 0x78);
        local_180 = *(pointer *)(lVar7 + 0x40);
        local_178 = *(undefined4 *)(lVar7 + 0x48);
        local_170 = local_1b8;
        local_160 = *(ExecutionEngine **)(lVar7 + 0x50);
        local_158 = *(undefined4 *)(lVar7 + 0x58);
        local_150 = local_120;
        local_148 = (undefined4)local_128;
        local_50._M_len = 5;
        local_168 = VVar9.t;
        local_50._M_array = (Expression *)local_190;
        dynet::expr::detail::
        f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
                  ((detail *)local_b0,&local_50);
        dynet::expr::cmult((expr *)&local_40,(Expression *)(*(long *)(lVar11 + lVar5) + 0x60),
                           (Expression *)(*(long *)(lVar2 + -0x18) + lVar10));
        dynet::expr::operator+((expr *)&local_110,(Expression *)local_b0,&local_40);
      }
      uVar4 = local_c0;
      lVar7 = local_d0;
      local_1a8 = (undefined1  [8])local_110.pg;
      local_1a0 = CONCAT44(local_1a0._4_4_,local_110.i.t);
      dynet::expr::logistic((expr *)local_190,(Expression *)local_1a8);
      dynet::expr::tanh((expr *)&local_110,dVar13);
      dynet::expr::cmult((expr *)local_b0,(Expression *)local_190,&local_110);
      local_c0 = uVar4 + 1;
      lVar2 = *(long *)(local_c8 + -0x18);
      lVar11 = local_b8 + 0x18;
      local_1b8 = (ComputationGraph *)local_b0;
      *(undefined1 (*) [8])(lVar2 + lVar10) = local_b0;
      *(uint *)(lVar2 + 8 + lVar10) = local_a8._0_4_;
      lVar10 = lVar10 + 0x10;
      VVar9.t = local_a8._0_4_;
    } while (local_c0 < *(uint *)(lVar7 + 200));
  }
  lVar7 = *(long *)(local_c8 + -0x10);
  (local_90->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar7 + -0x10);
  (local_90->super_RNNBuilder).cur.t = *(int *)(lVar7 + -8);
  EVar14._8_8_ = lVar7;
  EVar14.pg = (ComputationGraph *)local_90;
  return EVar14;
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}